

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void __thiscall PSBTOutput::Unserialize<DataStream>(PSBTOutput *this,DataStream *s)

{
  long lVar1;
  pointer pbVar2;
  size_type sVar3;
  pointer puVar4;
  pointer puVar5;
  bool bVar6;
  bool bVar7;
  uint64_t uVar8;
  size_type sVar9;
  size_type sVar10;
  pointer pbVar11;
  char *pcVar12;
  PSBTOutput *v;
  pointer pbVar13;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar14;
  uint8_t leaf_ver;
  uint8_t depth;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  SpanReader s_tree;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> leaf_hashes;
  XOnlyPubKey xonly;
  PSBTProprietary this_prop;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_lookup._M_t._M_impl.super__Rb_tree_header._M_header;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar6 = false;
  key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == s->m_read_pos) break;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&key);
    puVar5 = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar6 = true;
      goto LAB_0059980f;
    }
    skey.m_data.m_size =
         (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    skey.m_data.m_data =
         key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    uVar8 = ReadCompactSize<SpanReader>(&skey,true);
    switch(uVar8) {
    case 0:
      pVar14 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Duplicate Key, output redeemScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        v = this;
        if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start == 1) goto LAB_00599668;
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output redeemScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_0059a1f9;
    case 1:
      pVar14 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Duplicate Key, output witnessScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      v = (PSBTOutput *)&this->witness_script;
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output witnessScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
LAB_00599668:
      Unserialize<DataStream,28u,unsigned_char>
                (s,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)v);
      break;
    case 2:
      DeserializeHDKeypaths<DataStream>(s,&key,&this->hd_keypaths);
      break;
    case 3:
    case 4:
switchD_00599326_caseD_3:
      sVar10 = std::
               map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::count(&this->unknown,&key);
      if (sVar10 != 0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Duplicate Key, key for unknown value already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      this_prop.subtype = 0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this_prop);
      std::
      _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
      ::
      _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  *)&this->unknown,&key,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this_prop);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this_prop);
      break;
    case 5:
      pVar14 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)
                           "Duplicate Key, output Taproot internal key already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)
                           "Output Taproot internal key key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      UnserializeFromVector<DataStream,XOnlyPubKey&>(s,&this->m_tap_internal_key);
      break;
    case 6:
      pVar14 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Duplicate Key, output Taproot tree already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output Taproot tree key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      leaf_hashes._M_t._M_impl._0_8_ = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
      s_tree.m_data.m_data = (uchar *)leaf_hashes._M_t._M_impl._0_8_;
      s_tree.m_data.m_size =
           leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
           leaf_hashes._M_t._M_impl._0_8_;
      if (s_tree.m_data.m_size == 0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output Taproot tree must not be empty");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      this_prop.subtype = CONCAT71(this_prop.subtype._1_7_,1);
      this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      while (s_tree.m_data.m_size != 0) {
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        depth = ser_readdata8<SpanReader>(&s_tree);
        leaf_ver = ser_readdata8<SpanReader>(&s_tree);
        Unserialize<SpanReader,unsigned_char,std::allocator<unsigned_char>>
                  (&s_tree,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
        if (0x80 < depth) {
          pcVar12 = (char *)__cxa_allocate_exception(0x20);
          std::iostream_category();
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar12,(error_code *)
                             "Output Taproot tree has as leaf greater than Taproot maximum depth");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_0059a1f9;
        }
        if ((leaf_ver & 1) != 0) {
          pcVar12 = (char *)__cxa_allocate_exception(0x20);
          std::iostream_category();
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar12,(error_code *)
                             "Output Taproot tree has a leaf with an invalid leaf version");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_0059a1f9;
        }
        std::
        vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        emplace_back<unsigned_char&,unsigned_char&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                  ((vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&this->m_tap_tree,&depth,&leaf_ver,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
        script.m_size =
             xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ -
             xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
        script.m_data = (uchar *)xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
        TaprootBuilder::Add((TaprootBuilder *)&this_prop,(uint)depth,script,(uint)leaf_ver,true);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&xonly);
      }
      bVar7 = TaprootBuilder::IsComplete((TaprootBuilder *)&this_prop);
      if (!bVar7) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = std::iostream_category();
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        xonly.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output Taproot tree is malformed");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::~vector((vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                 *)&this_prop.identifier);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&leaf_hashes);
      break;
    case 7:
      pVar14 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&key_lookup,&key);
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)
                           "Duplicate Key, output Taproot BIP32 keypath already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0x21) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output Taproot BIP32 keypath key is not at 33 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      vch.m_data = key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      vch.m_size = 0x20;
      base_blob<256U>::base_blob((base_blob<256U> *)&this_prop,vch);
      vch_00.m_size = 0x20;
      vch_00.m_data = (uchar *)&this_prop;
      base_blob<256U>::base_blob((base_blob<256U> *)&xonly,vch_00);
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pbVar11 = (pointer)ReadCompactSize<DataStream>(s,true);
      pbVar2 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_start;
      pbVar13 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      sVar3 = s->m_read_pos;
      Unserialize<DataStream,uint256,std::less<uint256>,std::allocator<uint256>>(s,&leaf_hashes);
      pbVar13 = pbVar13 + (long)((s->vch).
                                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                (s->m_read_pos -
                                (long)((s->vch).
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish +
                                      (long)(pbVar2 + sVar3))));
      if (pbVar11 < pbVar13) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Output Taproot BIP32 keypath has an invalid length");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      DeserializeKeyOrigin<DataStream>((KeyOriginInfo *)&s_tree,s,(long)pbVar11 - (long)pbVar13);
      std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
      pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>_&,_KeyOriginInfo,_true>
                ((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)&this_prop,&leaf_hashes,(KeyOriginInfo *)&s_tree);
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                  *)&this->m_tap_bip32_paths,&xonly,
                 (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)&this_prop);
      std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
      ~pair((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo> *)
            &this_prop);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&s_tree.m_data.m_size)
      ;
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&leaf_hashes._M_t);
      break;
    default:
      if (uVar8 != 0xfc) goto switchD_00599326_caseD_3;
      this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_prop.key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      this_prop.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Unserialize<SpanReader,unsigned_char,std::allocator<unsigned_char>>
                (&skey,&this_prop.identifier);
      this_prop.subtype = ReadCompactSize<SpanReader>(&skey,true);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this_prop.key,&key);
      sVar9 = std::
              set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::
              count(&this->m_proprietary,(key_type *)&this_prop);
      if (sVar9 != 0) {
        pcVar12 = (char *)__cxa_allocate_exception(0x20);
        leaf_hashes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = std::iostream_category();
        leaf_hashes._M_t._M_impl._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar12,(error_code *)"Duplicate Key, proprietary key already found");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0059a1f9;
      }
      Unserialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&this_prop.value);
      std::
      _Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
      ::_M_insert_unique<PSBTProprietary_const&>
                ((_Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
                  *)&this->m_proprietary,&this_prop);
      PSBTProprietary::~PSBTProprietary(&this_prop);
    }
LAB_0059980f:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  } while (puVar4 != puVar5);
  if (bVar6) {
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~_Rb_tree(&key_lookup._M_t);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar12 = (char *)__cxa_allocate_exception(0x20);
    this_prop.identifier.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)std::iostream_category();
    this_prop.subtype = CONCAT44(this_prop.subtype._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar12,(error_code *)"Separator is missing at the end of an output map");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar12,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_0059a1f9:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Read loop
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_OUT_REDEEMSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output redeemScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output redeemScript key is more than one byte type");
                    }
                    s >> redeem_script;
                    break;
                }
                case PSBT_OUT_WITNESSSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output witnessScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output witnessScript key is more than one byte type");
                    }
                    s >> witness_script;
                    break;
                }
                case PSBT_OUT_BIP32_DERIVATION:
                {
                    DeserializeHDKeypaths(s, key, hd_keypaths);
                    break;
                }
                case PSBT_OUT_TAP_INTERNAL_KEY:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot internal key already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output Taproot internal key key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_internal_key);
                    break;
                }
                case PSBT_OUT_TAP_TREE:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot tree already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output Taproot tree key is more than one byte type");
                    }
                    std::vector<unsigned char> tree_v;
                    s >> tree_v;
                    SpanReader s_tree{tree_v};
                    if (s_tree.empty()) {
                        throw std::ios_base::failure("Output Taproot tree must not be empty");
                    }
                    TaprootBuilder builder;
                    while (!s_tree.empty()) {
                        uint8_t depth;
                        uint8_t leaf_ver;
                        std::vector<unsigned char> script;
                        s_tree >> depth;
                        s_tree >> leaf_ver;
                        s_tree >> script;
                        if (depth > TAPROOT_CONTROL_MAX_NODE_COUNT) {
                            throw std::ios_base::failure("Output Taproot tree has as leaf greater than Taproot maximum depth");
                        }
                        if ((leaf_ver & ~TAPROOT_LEAF_MASK) != 0) {
                            throw std::ios_base::failure("Output Taproot tree has a leaf with an invalid leaf version");
                        }
                        m_tap_tree.emplace_back(depth, leaf_ver, script);
                        builder.Add((int)depth, script, (int)leaf_ver, /*track=*/true);
                    }
                    if (!builder.IsComplete()) {
                        throw std::ios_base::failure("Output Taproot tree is malformed");
                    }
                    break;
                }
                case PSBT_OUT_TAP_BIP32_DERIVATION:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot BIP32 keypath already provided");
                    } else if (key.size() != 33) {
                        throw std::ios_base::failure("Output Taproot BIP32 keypath key is not at 33 bytes");
                    }
                    XOnlyPubKey xonly(uint256(Span<uint8_t>(key).last(32)));
                    std::set<uint256> leaf_hashes;
                    uint64_t value_len = ReadCompactSize(s);
                    size_t before_hashes = s.size();
                    s >> leaf_hashes;
                    size_t after_hashes = s.size();
                    size_t hashes_len = before_hashes - after_hashes;
                    if (hashes_len > value_len) {
                        throw std::ios_base::failure("Output Taproot BIP32 keypath has an invalid length");
                    }
                    size_t origin_len = value_len - hashes_len;
                    m_tap_bip32_paths.emplace(xonly, std::make_pair(leaf_hashes, DeserializeKeyOrigin(s, origin_len)));
                    break;
                }
                case PSBT_OUT_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default: {
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                    break;
                }
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of an output map");
        }
    }